

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_startShaderProgram(qpTestLog *log,deBool linkOk,char *linkInfoLog)

{
  deBool dVar1;
  deBool dVar2;
  qpXmlAttribute programAttribs [4];
  qpXmlAttribute local_98 [4];
  
  deMutex_lock(log->lock);
  local_98[0].stringValue = "OK";
  if (linkOk == 0) {
    local_98[0].stringValue = "Fail";
  }
  local_98[0].name = "LinkStatus";
  local_98[0].type = QP_XML_ATTRIBUTE_STRING;
  local_98[0].intValue = -0x2a6;
  local_98[0].boolValue = -1;
  dVar2 = 1;
  dVar1 = qpXmlWriter_startElement(log->writer,"ShaderProgram",1,local_98);
  if (dVar1 != 0) {
    dVar1 = qpXmlWriter_writeStringElement(log->writer,"InfoLog",linkInfoLog);
    if (dVar1 != 0) goto LAB_002110e5;
  }
  dVar2 = 0;
  qpPrintf("qpTestLog_startShaderProgram(): Writing XML failed\n");
LAB_002110e5:
  deMutex_unlock(log->lock);
  return dVar2;
}

Assistant:

deBool qpTestLog_startShaderProgram (qpTestLog* log, deBool linkOk, const char* linkInfoLog)
{
	qpXmlAttribute	programAttribs[4];
	int				numProgramAttribs = 0;

	DE_ASSERT(log);
	deMutex_lock(log->lock);

	programAttribs[numProgramAttribs++] = qpSetStringAttrib("LinkStatus", linkOk ? "OK" : "Fail");

	if (!qpXmlWriter_startElement(log->writer, "ShaderProgram", numProgramAttribs, programAttribs) ||
		!qpXmlWriter_writeStringElement(log->writer, "InfoLog", linkInfoLog))
	{
		qpPrintf("qpTestLog_startShaderProgram(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_SHADERPROGRAM));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}